

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlxContext.cpp
# Opt level: O0

void __thiscall sf::priv::GlxContext::GlxContext(GlxContext *this,GlxContext *shared)

{
  Display *pDVar1;
  undefined8 *in_RDI;
  uint in_stack_000000bc;
  uint in_stack_000000c0;
  uint in_stack_000000c4;
  GlxContext *in_stack_000000c8;
  GlxContext *in_stack_000000d0;
  GlxContext *in_stack_000001a8;
  GlxContext *in_stack_000001b0;
  int in_stack_ffffffffffffff6c;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff74;
  GlContext *in_stack_ffffffffffffff90;
  ContextSettings local_2c;
  
  GlContext::GlContext(in_stack_ffffffffffffff90);
  *in_RDI = &PTR__GlxContext_001d7c38;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  uVar2 = 0;
  ContextSettings::ContextSettings(&local_2c,0,0,0,1,1,0,false);
  *(ulong *)((long)in_RDI + 0x11) = CONCAT17((undefined1)local_2c.minorVersion,local_2c._9_7_);
  *(undefined8 *)((long)in_RDI + 0x19) = local_2c._17_8_;
  in_RDI[1] = local_2c._0_8_;
  in_RDI[2] = CONCAT71(local_2c._9_7_,(undefined1)local_2c.antialiasingLevel);
  pDVar1 = OpenDisplay();
  in_RDI[6] = pDVar1;
  ensureExtensionsInit
            ((Display *)CONCAT44(in_stack_ffffffffffffff74,uVar2),in_stack_ffffffffffffff6c);
  VideoMode::getDesktopMode();
  createSurface(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,
                in_stack_000000bc);
  createContext(in_stack_000001b0,in_stack_000001a8);
  return;
}

Assistant:

GlxContext::GlxContext(GlxContext* shared) :
m_display   (NULL),
m_window    (0),
m_context   (NULL),
m_pbuffer   (0),
m_ownsWindow(false)
{
    // Save the creation settings
    m_settings = ContextSettings();

    // Open the connection with the X server
    m_display = OpenDisplay();

    // Make sure that extensions are initialized
    ensureExtensionsInit(m_display, DefaultScreen(m_display));

    // Create the rendering surface (window or pbuffer if supported)
    createSurface(shared, 1, 1, VideoMode::getDesktopMode().bitsPerPixel);

    // Create the context
    createContext(shared);
}